

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O0

CategoryFilter __thiscall
QLoggingRegistry::installFilter(QLoggingRegistry *this,CategoryFilter filter)

{
  long lVar1;
  code *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  CategoryFilter old;
  scoped_lock<QMutex> locker;
  QMutex *in_stack_ffffffffffffffa8;
  QLoggingRegistry *in_stack_ffffffffffffffb8;
  CategoryFilter p_Var2;
  code *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (anonymous_namespace)::qt_scoped_lock<QMutex,std::scoped_lock<QMutex>>(in_stack_ffffffffffffffa8);
  local_20 = in_RSI;
  if (in_RSI == (code *)0x0) {
    local_20 = defaultCategoryFilter;
  }
  p_Var2 = *(CategoryFilter *)(in_RDI + 0x70);
  *(code **)(in_RDI + 0x70) = local_20;
  updateRules(in_stack_ffffffffffffffb8);
  std::scoped_lock<QMutex>::~scoped_lock((scoped_lock<QMutex> *)0x2d5c66);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return p_Var2;
  }
  __stack_chk_fail();
}

Assistant:

QLoggingCategory::CategoryFilter
QLoggingRegistry::installFilter(QLoggingCategory::CategoryFilter filter)
{
    const auto locker = qt_scoped_lock(registryMutex);

    if (!filter)
        filter = defaultCategoryFilter;

    QLoggingCategory::CategoryFilter old = categoryFilter;
    categoryFilter = filter;

    updateRules();

    return old;
}